

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_paeth_predictor_32x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [32];
  ushort uVar2;
  __m256i *in_RCX;
  __m256i *in_RDX;
  uint8_t *in_RSI;
  uint8_t *above_00;
  uint8_t *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar3 [16];
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 auVar5 [16];
  undefined1 auVar4 [32];
  __m256i r;
  __m256i l16;
  int i;
  __m256i one;
  __m256i rep;
  __m256i tl;
  __m256i t1;
  __m256i t0;
  __m256i l;
  undefined8 local_320;
  undefined8 uStackY_318;
  undefined8 uStackY_310;
  undefined8 uStackY_308;
  undefined4 in_stack_fffffffffffffd38;
  int iVar6;
  undefined1 local_2a0 [32];
  uint8_t *local_1e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  __m256i *palStack_70;
  undefined8 uStack_68;
  
  above_00 = in_RSI;
  get_left_vector(in_RCX,in_RSI);
  get_top_vector(in_RDX,above_00);
  get_top_vector((__m256i *)(*in_RDX + 2),above_00);
  uVar2 = (ushort)*(byte *)((long)in_RDX[-1] + 0x1f);
  auVar5 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,2);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,3);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,4);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,5);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,6);
  vpinsrw_avx(auVar5,(uint)uVar2,7);
  auVar5 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,2);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,3);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,4);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,5);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,6);
  vpinsrw_avx(auVar5,(uint)uVar2,7);
  auVar5 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar5 = vpinsrw_avx(auVar5,0x8000,2);
  auVar5 = vpinsrw_avx(auVar5,0x8000,3);
  auVar5 = vpinsrw_avx(auVar5,0x8000,4);
  auVar5 = vpinsrw_avx(auVar5,0x8000,5);
  auVar5 = vpinsrw_avx(auVar5,0x8000,6);
  local_2a0._0_16_ = vpinsrw_avx(auVar5,0x8000,7);
  auVar5 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar5 = vpinsrw_avx(auVar5,0x8000,2);
  auVar5 = vpinsrw_avx(auVar5,0x8000,3);
  auVar5 = vpinsrw_avx(auVar5,0x8000,4);
  auVar5 = vpinsrw_avx(auVar5,0x8000,5);
  auVar5 = vpinsrw_avx(auVar5,0x8000,6);
  auVar5 = vpinsrw_avx(auVar5,0x8000,7);
  uStack_b0 = auVar5._0_8_;
  uStack_a8 = auVar5._8_8_;
  local_2a0._16_8_ = uStack_b0;
  local_2a0._24_8_ = uStack_a8;
  auVar5 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar5 = vpinsrw_avx(auVar5,1,2);
  auVar5 = vpinsrw_avx(auVar5,1,3);
  auVar5 = vpinsrw_avx(auVar5,1,4);
  auVar5 = vpinsrw_avx(auVar5,1,5);
  auVar5 = vpinsrw_avx(auVar5,1,6);
  auVar5 = vpinsrw_avx(auVar5,1,7);
  auVar3 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar3 = vpinsrw_avx(auVar3,1,2);
  auVar3 = vpinsrw_avx(auVar3,1,3);
  auVar3 = vpinsrw_avx(auVar3,1,4);
  auVar3 = vpinsrw_avx(auVar3,1,5);
  auVar3 = vpinsrw_avx(auVar3,1,6);
  auVar3 = vpinsrw_avx(auVar3,1,7);
  auVar3 = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar3;
  auVar5 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
  palStack_70 = auVar5._0_8_;
  uStack_68 = auVar5._8_8_;
  local_1e8 = in_RDI;
  for (iVar6 = 0; iVar6 < 0x10; iVar6 = iVar6 + 1) {
    auVar1._8_8_ = in_XMM0_Qb;
    auVar1._0_8_ = in_XMM0_Qa;
    auVar1._16_8_ = in_YMM0_H;
    auVar1._24_8_ = in_register_00001218;
    auVar4 = vpshufb_avx2(auVar1,local_2a0);
    paeth_32x1_pred(palStack_70,auVar3._8_8_,auVar3._0_8_,
                    (__m256i *)CONCAT44(iVar6,in_stack_fffffffffffffd38));
    local_320 = auVar4._0_8_;
    uStackY_318 = auVar4._8_8_;
    uStackY_310 = auVar4._16_8_;
    uStackY_308 = auVar4._24_8_;
    *(undefined8 *)local_1e8 = local_320;
    *(undefined8 *)(local_1e8 + 8) = uStackY_318;
    *(undefined8 *)(local_1e8 + 0x10) = uStackY_310;
    *(undefined8 *)(local_1e8 + 0x18) = uStackY_308;
    local_1e8 = in_RSI + (long)local_1e8;
    auVar4._16_8_ = palStack_70;
    auVar4._0_16_ = auVar3;
    auVar4._24_8_ = uStack_68;
    local_2a0 = vpaddw_avx2(local_2a0,auVar4);
  }
  return;
}

Assistant:

void aom_paeth_predictor_32x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i l = get_left_vector(left);
  const __m256i t0 = get_top_vector(above);
  const __m256i t1 = get_top_vector(above + 16);
  const __m256i tl = _mm256_set1_epi16((int16_t)above[-1]);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  const __m256i one = _mm256_set1_epi16(1);

  int i;
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);

    const __m256i r = paeth_32x1_pred(&l16, &t0, &t1, &tl);

    _mm256_storeu_si256((__m256i *)dst, r);

    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}